

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

xmlTextReaderPtr xmlReaderForMemory(char *buffer,int size,char *URL,char *encoding,int options)

{
  xmlParserInputBufferPtr input;
  xmlTextReaderPtr reader;
  
  reader = (xmlTextReaderPtr)0x0;
  input = xmlParserInputBufferCreateStatic(buffer,size,XML_CHAR_ENCODING_NONE);
  if (input != (xmlParserInputBufferPtr)0x0) {
    reader = xmlNewTextReader(input,URL);
    if (reader == (xmlTextReaderPtr)0x0) {
      xmlFreeParserInputBuffer(input);
      reader = (xmlTextReaderPtr)0x0;
    }
    else {
      *(byte *)&reader->allocs = (byte)reader->allocs | 1;
      xmlTextReaderSetup(reader,(xmlParserInputBufferPtr)0x0,URL,encoding,options);
    }
  }
  return reader;
}

Assistant:

xmlTextReaderPtr
xmlReaderForMemory(const char *buffer, int size, const char *URL,
                   const char *encoding, int options)
{
    xmlTextReaderPtr reader;
    xmlParserInputBufferPtr buf;

    buf = xmlParserInputBufferCreateStatic(buffer, size,
                                      XML_CHAR_ENCODING_NONE);
    if (buf == NULL) {
        return (NULL);
    }
    reader = xmlNewTextReader(buf, URL);
    if (reader == NULL) {
        xmlFreeParserInputBuffer(buf);
        return (NULL);
    }
    reader->allocs |= XML_TEXTREADER_INPUT;
    xmlTextReaderSetup(reader, NULL, URL, encoding, options);
    return (reader);
}